

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChAssembly.cpp
# Opt level: O2

shared_ptr<chrono::ChPhysicsItem> __thiscall chrono::ChAssembly::Search(ChAssembly *this,char *name)

{
  _Alloc_hider _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  shared_ptr<chrono::ChPhysicsItem> sVar3;
  shared_ptr<chrono::ChBody> mbo;
  _func_int **local_30;
  _Alloc_hider local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  SearchBody((ChAssembly *)&stack0xffffffffffffffd0,name);
  if (local_30 == (_func_int **)0x0) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8);
    SearchShaft((ChAssembly *)&stack0xffffffffffffffd0,name);
    if (local_30 == (_func_int **)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8);
      SearchLink((ChAssembly *)&stack0xffffffffffffffd0,name);
      if (local_30 == (_func_int **)0x0) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8);
        SearchMesh((ChAssembly *)&stack0xffffffffffffffd0,name);
        if (local_30 == (_func_int **)0x0) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8);
          sVar3 = SearchOtherPhysicsItem(this,name);
          _Var2 = sVar3.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
          if ((this->super_ChPhysicsItem).super_ChObj._vptr_ChObj == (_func_int **)0x0) {
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &(this->super_ChPhysicsItem).super_ChObj.m_name);
            (this->super_ChPhysicsItem).super_ChObj._vptr_ChObj = (_func_int **)0x0;
            (this->super_ChPhysicsItem).super_ChObj.m_name._M_dataplus._M_p = (pointer)0x0;
            _Var2._M_pi = extraout_RDX_00;
          }
          goto LAB_00a86d69;
        }
      }
    }
  }
  _Var1._M_p = local_28._M_p;
  (this->super_ChPhysicsItem).super_ChObj._vptr_ChObj = local_30;
  local_28._M_p = (pointer)0x0;
  local_30 = (_func_int **)0x0;
  (this->super_ChPhysicsItem).super_ChObj.m_name._M_dataplus._M_p = _Var1._M_p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd8);
  _Var2._M_pi = extraout_RDX;
LAB_00a86d69:
  sVar3.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_ChPhysicsItem;
  return (shared_ptr<chrono::ChPhysicsItem>)
         sVar3.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChPhysicsItem> ChAssembly::Search(const char* name) {
    if (auto mbo = SearchBody(name))
        return mbo;

    if (auto msh = SearchShaft(name))
        return msh;

    if (auto mli = SearchLink(name))
        return mli;

    if (auto mesh = SearchMesh(name))
        return mesh;

    if (auto mph = SearchOtherPhysicsItem(name))
        return mph;

    return std::shared_ptr<ChPhysicsItem>();  // not found; return an empty shared_ptr
}